

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.h
# Opt level: O1

secp256k1_context * jbcoin::secp256k1Context<void>(void)

{
  int iVar1;
  
  if (secp256k1Context<void>()::h == '\0') {
    iVar1 = __cxa_guard_acquire(&secp256k1Context<void>()::h);
    if (iVar1 != 0) {
      secp256k1Context<void>::h.impl = secp256k1_context_create(0x301);
      __cxa_atexit(secp256k1Context<void>::holder::~holder,&secp256k1Context<void>::h,&__dso_handle)
      ;
      __cxa_guard_release(&secp256k1Context<void>()::h);
    }
  }
  return secp256k1Context<void>::h.impl;
}

Assistant:

secp256k1_context const*
secp256k1Context()
{
    struct holder
    {
        secp256k1_context* impl;
        holder()
            : impl (secp256k1_context_create(
                SECP256K1_CONTEXT_VERIFY |
                SECP256K1_CONTEXT_SIGN))
        {
        }

        ~holder()
        {
            secp256k1_context_destroy(impl);
        }
    };
    static holder const h;
    return h.impl;
}